

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O2

int N_VWrmsNormMaskVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,N_Vector id,realtype *nrm)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  realtype rVar8;
  double dVar9;
  double dVar10;
  
  if (0 < nvec) {
    if (nvec == 1) {
      rVar8 = N_VWrmsNormMask_Serial(*X,*W,id);
      *nrm = rVar8;
    }
    else {
      lVar1 = *(*X)->content;
      lVar6 = lVar1;
      if (lVar1 < 1) {
        lVar6 = 0;
      }
      lVar2 = *(long *)((long)id->content + 0x10);
      for (uVar7 = 0; uVar7 != (uint)nvec; uVar7 = uVar7 + 1) {
        lVar3 = *(long *)((long)X[uVar7]->content + 0x10);
        lVar4 = *(long *)((long)W[uVar7]->content + 0x10);
        nrm[uVar7] = 0.0;
        dVar9 = 0.0;
        for (lVar5 = 0; lVar6 != lVar5; lVar5 = lVar5 + 1) {
          if (0.0 < *(double *)(lVar2 + lVar5 * 8)) {
            dVar10 = *(double *)(lVar3 + lVar5 * 8) * *(double *)(lVar4 + lVar5 * 8);
            dVar9 = dVar9 + dVar10 * dVar10;
            nrm[uVar7] = dVar9;
          }
        }
        dVar9 = dVar9 / (double)lVar1;
        dVar10 = 0.0;
        if (0.0 < dVar9) {
          if (dVar9 < 0.0) {
            dVar10 = sqrt(dVar9);
          }
          else {
            dVar10 = SQRT(dVar9);
          }
        }
        nrm[uVar7] = dVar10;
      }
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VWrmsNormMaskVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                      N_Vector id, realtype* nrm)
{
  int          i;
  sunindextype j, N;
  realtype*    wd=NULL;
  realtype*    xd=NULL;
  realtype*    idd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VWrmsNorm */
  if (nvec == 1) {
    nrm[0] = N_VWrmsNormMask_Serial(X[0], W[0], id);
    return(0);
  }

  /* get vector length and mask data array */
  N   = NV_LENGTH_S(X[0]);
  idd = NV_DATA_S(id);

  /* compute the WRMS norm for each vector in the vector array */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    wd = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j=0; j<N; j++) {
      if (idd[j] > ZERO)
        nrm[i] += SUNSQR(xd[j] * wd[j]);
    }
    nrm[i] = SUNRsqrt(nrm[i]/N);
  }

  return(0);
}